

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O1

void __thiscall mat<2UL,_3UL>::set_col(mat<2UL,_3UL> *this,size_t idx,vec<2UL,_double> *v)

{
  long lVar1;
  long lVar2;
  
  if (2 < idx) {
    __assert_fail("idx >= 0 && idx < ncols",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                  ,0xbe,
                  "void mat<2, 3>::set_col(const size_t, const vec<nrows, double> &) [nrows = 2, ncols = 3]"
                 );
  }
  lVar1 = (ulong)(idx != 1) * 8 + 8;
  if (idx == 0) {
    lVar1 = 0;
  }
  lVar2 = 0x18;
  do {
    if (2 < idx) {
      __assert_fail("i >= 0 && i < 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cdgiessen[P]TinyRenderer/ext/geometry.h"
                    ,0x8c,"T &vec<3>::operator[](const size_t) [n = 3, T = double]");
    }
    *(double *)((long)&this->rows[0].x + lVar2 + lVar1) = (&v->x)[lVar2 != 0];
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  return;
}

Assistant:

void set_col(const size_t idx, const vec<nrows, double>& v)
    {
        assert(idx >= 0 && idx < ncols);
        for (size_t i = nrows; i--; rows[i][idx] = v[i])
            ;
    }